

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O1

uint __thiscall
FMB::FiniteModelMultiSorted::args2var
          (FiniteModelMultiSorted *this,DArray<unsigned_int> *args,DArray<unsigned_int> *sizes,
          DArray<unsigned_int> *offsets,uint s,OperatorType *sig)

{
  uint uVar1;
  TermList TVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  uVar3 = offsets->_array[s];
  if (args->_size != 0) {
    iVar4 = 1;
    uVar6 = 0;
    do {
      uVar1 = args->_array[uVar6];
      uVar5 = (uint)uVar6;
      if (uVar5 < sig->_typeArgsArity) {
        TVar2 = Kernel::AtomicSort::superSort();
      }
      else {
        TVar2._content = *(uint64_t *)(sig->_key + (ulong)(uVar5 - sig->_typeArgsArity) * 8 + 8);
      }
      iVar7 = (uVar1 - 1) * iVar4;
      iVar4 = iVar4 * sizes->_array[*(uint *)(TVar2._content + 8)];
      uVar3 = uVar3 + iVar7;
      uVar6 = (ulong)(uVar5 + 1);
    } while (uVar6 < args->_size);
  }
  return uVar3;
}

Assistant:

unsigned args2var(const DArray<unsigned>& args, const DArray<unsigned>& sizes,
                    const DArray<unsigned>& offsets, unsigned s, OperatorType* sig)
  {
    unsigned var = offsets[s];
    unsigned mult = 1;
    for(unsigned i=0;i<args.size();i++){
      var += mult*(args[i]-1);
      unsigned s = sig->arg(i).term()->functor();
      mult *=sizes[s];
    }
    return var;
  }